

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O3

void __thiscall
AutoArgParse::ArgParser::printAllUsageInfo(ArgParser *this,ostream *os,string *programName)

{
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Elt_pointer pbVar2;
  _Elt_pointer pPVar3;
  bool bVar4;
  reference this_01;
  ostream *poVar5;
  _Elt_pointer pPVar6;
  PrintGroup *pg;
  _Elt_pointer pPVar7;
  _Map_pointer ppPVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->helpFlag != (ComplexFlag<AutoArgParse::ArgParser::HelpFlagTrigger> *)0x0) &&
     (this->firstTimePrinting == true)) {
    this->firstTimePrinting = false;
    pbVar2 = (this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).store.flagInsertionOrder.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).store.flagInsertionOrder.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pbVar2) {
      this_00 = &(this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).store.flagInsertionOrder;
      local_50._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      paVar1 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar1) {
        local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_50._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(this_00);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"Usage: ",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(programName->_M_dataplus)._M_p,programName->_M_string_length);
  (*(this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).
    super_Flag<AutoArgParse::DoNothingTrigger>.super_FlagBase.super_ParseToken._vptr_ParseToken[4])
            (this,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n\nArguments:\n",0xd);
  ppPVar8 = (this->printGroups).
            super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->printGroups).
             super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->printGroups).
             super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x2c8590b21642c859 +
      ((long)(this->printGroups).
             super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->printGroups).
             super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x2c8590b21642c859 +
      (((long)ppPVar8 -
        (long)(this->printGroups).
              super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppPVar8 == (_Map_pointer)0x0)) * 2 == 1) {
    this_01 = std::deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>::at
                        (&this->printGroups,0);
    PrintGroup::printUsageHelp(this_01,os);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "The options are divided into the following groups.  Use --help group_name to detail the options under a particular group:\n"
               ,0x7a);
    pPVar7 = (this->printGroups).
             super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    pPVar3 = (this->printGroups).
             super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pPVar7 != pPVar3) {
      pPVar6 = (this->printGroups).
               super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppPVar8 = (this->printGroups).
                super__Deque_base<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      bVar4 = true;
      do {
        if (!bVar4) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(pPVar7->name)._M_dataplus._M_p,(pPVar7->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  -- ",5);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(pPVar7->description)._M_dataplus._M_p,
                              (pPVar7->description)._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
        pPVar7 = pPVar7 + 1;
        if (pPVar7 == pPVar6) {
          pPVar7 = ppPVar8[1];
          ppPVar8 = ppPVar8 + 1;
          pPVar6 = pPVar7 + 2;
        }
        bVar4 = false;
      } while (pPVar7 != pPVar3);
    }
    if (this->helpFlag != (ComplexFlag<AutoArgParse::ArgParser::HelpFlagTrigger> *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"--help prints this message.\n",0x1c);
    }
  }
  return;
}

Assistant:

AUTOARGPARSE_INLINE void ArgParser::printAllUsageInfo(
    std::ostream& os, const std::string& programName) {
    if (helpFlag && firstTimePrinting) {
        firstTimePrinting = false;
        // help flag would have been the first thing added, move it to the end.
        store.rotateLeft();
    }
    os << "Usage: " << programName;
    printUsageSummary(os);
    os << "\n\nArguments:\n";
    if (printGroups.size() == 1) {
        printGroups.at(0).printUsageHelp(os);
        return;
    }
    os << "The options are divided into the following groups.  Use --help "
          "group_name to detail the options under a particular group:\n";
    bool first = true;
    for (auto& pg : printGroups) {
        if (first) {
            first = false;
            continue;
        }
        os << pg.getName() << "  -- " << pg.getDescription() << std::endl;
    }
    if (helpFlag) {
        os << "--help prints this message.\n";
    }
}